

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O0

string * dto::marshall<dto::Complex>(string *__return_storage_ptr__,Complex *dto)

{
  long lVar1;
  void *pvVar2;
  void *__src;
  size_t __n;
  allocator<char> local_1e;
  undefined1 local_1d;
  int local_1c;
  Complex *pCStack_18;
  int hdr_size;
  Complex *dto_local;
  string *str;
  
  pCStack_18 = dto;
  dto_local = (Complex *)__return_storage_ptr__;
  do_hton(&dto->header);
  local_1c = 0x1a;
  local_1d = 0;
  lVar1 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,lVar1 + 0x1a,'\0',&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  pvVar2 = (void *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  memcpy(pvVar2,pCStack_18,(long)local_1c);
  pvVar2 = (void *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  __src = (void *)std::__cxx11::string::operator[]((ulong)&pCStack_18->payload);
  __n = std::__cxx11::string::size();
  memcpy(pvVar2,__src,__n);
  do_ntoh(&pCStack_18->header);
  return __return_storage_ptr__;
}

Assistant:

inline std::string marshall(T &dto) {
  do_hton(&(dto.header));
  int hdr_size = sizeof(decltype(dto.header));
  std::string str(hdr_size + dto.payload.size(), '\0');
  memcpy(&str[0], &(dto.header), hdr_size);
  memcpy(&str[hdr_size], &dto.payload[0], dto.payload.size());
  do_ntoh(&(dto.header));
  return str;
}